

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O1

int anon_unknown.dwarf_1256b::RtMidiIn_ctor(lua_State *L)

{
  RtMidi *midi;
  mapped_type *pmVar1;
  string local_48;
  
  midi = (RtMidi *)lua_newuserdata(L,0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RtMidi Input Client","");
  RtMidiIn::RtMidiIn((RtMidiIn *)midi,UNSPECIFIED,&local_48,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  RtMidi_init(midi,L,-1);
  local_48._M_dataplus._M_p = (pointer)midi;
  local_48._M_string_length = (size_type)L;
  pmVar1 = std::
           map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
           ::operator[]((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidiIn_callbacks,(key_type *)&local_48);
  *pmVar1 = -2;
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidiin");
  lua_setmetatable(L,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiIn_ctor(lua_State *L) {
	auto midiin = reinterpret_cast<RtMidiIn *>(
	 lua_newuserdata(L, sizeof(RtMidiIn)));
	try {
		new (midiin) RtMidiIn { };
		RtMidi_init(*midiin, L, -1);
		RtMidiIn_callbacks[{midiin, L}] = LUA_NOREF;
		luaL_getmetatable(L, MT_RTMIDIIN);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}